

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O2

bool __thiscall QLocalSocket::waitForConnected(QLocalSocket *this,int msec)

{
  QLocalSocketPrivate *this_00;
  QDeadlineTimer QVar1;
  LocalSocketState LVar2;
  int iVar3;
  nanoseconds nVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_70;
  undefined1 local_58 [24];
  pollfd local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLocalSocketPrivate **)&this->field_0x8;
  LVar2 = state(this);
  if (LVar2 == ConnectingState) {
    local_40 = (pollfd)((ulong)(uint)this_00->connectingSocket | 0x100000000);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_58,(long)msec,CoarseTimer);
    QDeadlineTimer::remainingTimeAsDuration((QDeadlineTimer *)local_58);
    do {
      QVar1.t2 = local_58._8_4_;
      QVar1.type = local_58._12_4_;
      QVar1.t1 = local_58._0_8_;
      iVar3 = qt_safe_poll(&local_40,1,QVar1);
      if (iVar3 == -1) {
        latin1.m_data = "QLocalSocket::waitForConnected";
        latin1.m_size = 0x1e;
        QString::QString((QString *)&local_70,latin1);
        QLocalSocketPrivate::setErrorAndEmit(this_00,UnknownSocketError,(QString *)&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      }
      else if (0 < iVar3) {
        QLocalSocketPrivate::_q_connectToSocket(this_00);
      }
      LVar2 = state(this);
      if (LVar2 != ConnectingState) break;
      nVar4 = QDeadlineTimer::remainingTimeAsDuration((QDeadlineTimer *)local_58);
    } while (0 < nVar4.__r);
  }
  LVar2 = state(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return LVar2 == ConnectedState;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalSocket::waitForConnected(int msec)
{
    Q_D(QLocalSocket);

    if (state() != ConnectingState)
        return (state() == ConnectedState);

    pollfd pfd = qt_make_pollfd(d->connectingSocket, POLLIN);

    QDeadlineTimer deadline{msec};
    auto remainingTime = deadline.remainingTimeAsDuration();

    do {
        const int result = qt_safe_poll(&pfd, 1, deadline);
        if (result == -1)
            d->setErrorAndEmit(QLocalSocket::UnknownSocketError,
                               "QLocalSocket::waitForConnected"_L1);
        else if (result > 0)
            d->_q_connectToSocket();
    } while (state() == ConnectingState
             && (remainingTime = deadline.remainingTimeAsDuration()) > 0ns);

    return (state() == ConnectedState);
}